

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

string * __thiscall
kratos::SystemVerilogCodeGen::get_var_width_str_abi_cxx11_
          (string *__return_storage_ptr__,SystemVerilogCodeGen *this,Var *var)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  Var *pVVar5;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_RCX;
  char (*format_str) [6];
  char (*extraout_RDX) [8];
  char (*extraout_RDX_00) [8];
  char (*format_str_00) [8];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  allocator<char> local_199;
  string local_198;
  v7 local_178 [32];
  string local_158;
  string local_128 [8];
  string width;
  Var *var_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_f8;
  basic_string_view<char> local_e8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_d8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_b8;
  string *local_b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_a8;
  basic_string_view<char> local_98;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_68;
  string *local_60;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  width.field_2._8_8_ = this;
  std::__cxx11::string::string(local_128);
  bVar1 = Var::parametrized((Var *)width.field_2._8_8_);
  if (bVar1) {
    pVVar5 = Var::width_param((Var *)width.field_2._8_8_);
    (*(pVVar5->super_IRNode)._vptr_IRNode[0x1f])(local_178);
    local_b0 = &local_158;
    local_b8 = "{0}-1";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_178;
    local_d8.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string,char[6],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"{0}-1",(v7 *)vargs,format_str,in_RCX);
    local_c8 = &local_d8;
    local_e8 = fmt::v7::to_string_view<char,_0>(local_b8);
    local_40 = &local_f8;
    local_48 = local_c8;
    local_38 = local_c8;
    local_10 = local_c8;
    local_30 = local_40;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_40,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_c8->string);
    format_str_01.size_ = local_f8.desc_;
    format_str_01.data_ = (char *)local_e8.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_f8.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_158,(detail *)local_e8.data_,format_str_01,args);
    std::__cxx11::string::operator=(local_128,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)local_178);
    in_RCX = (remove_reference_t<std::__cxx11::basic_string<char>_> *)local_f8.desc_;
  }
  else {
    uVar4 = Var::var_width((Var *)width.field_2._8_8_);
    std::__cxx11::to_string(&local_198,uVar4 - 1);
    std::__cxx11::string::operator=(local_128,(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
  }
  bVar1 = false;
  uVar4 = Var::var_width((Var *)width.field_2._8_8_);
  if (uVar4 < 2) {
LAB_003dd4e7:
    bVar3 = Var::parametrized((Var *)width.field_2._8_8_);
    format_str_00 = extraout_RDX_00;
    if (!bVar3) {
      std::allocator<char>::allocator();
      bVar1 = true;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_199);
      goto LAB_003dd640;
    }
  }
  else {
    bVar2 = (**(code **)(*(long *)width.field_2._8_8_ + 0xb8))();
    format_str_00 = extraout_RDX;
    if ((bVar2 & 1) != 0) goto LAB_003dd4e7;
  }
  local_68 = "[{0}:0]";
  vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_128;
  local_60 = __return_storage_ptr__;
  local_88.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string&,char[8],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"[{0}:0]",(v7 *)vargs_1,format_str_00,in_RCX);
  local_78 = &local_88;
  local_98 = fmt::v7::to_string_view<char,_0>(local_68);
  local_50 = &local_a8;
  local_58 = local_78;
  local_28 = local_78;
  local_18 = local_78;
  local_20 = local_50;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_50,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_78->string);
  format_str_02.size_ = local_a8.desc_;
  format_str_02.data_ = (char *)local_98.size_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_a8.field_1.values_;
  fmt::v7::detail::vformat_abi_cxx11_
            (__return_storage_ptr__,(detail *)local_98.data_,format_str_02,args_00);
LAB_003dd640:
  if (bVar1) {
    std::allocator<char>::~allocator(&local_199);
  }
  std::__cxx11::string::~string(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemVerilogCodeGen::get_var_width_str(const Var* var) {
    std::string width;
    if (var->parametrized()) {
        width = ::format("{0}-1", var->width_param()->to_string());
    } else {
        width = std::to_string(var->var_width() - 1);
    }
    return (var->var_width() > 1 && !var->is_struct()) || var->parametrized()
               ? ::format("[{0}:0]", width)
               : "";
}